

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

uchar * __thiscall
cimg_library::CImg<unsigned_char>::_atXYZC(CImg<unsigned_char> *this,int x,int y,int z,int c)

{
  int iVar1;
  uchar *puVar2;
  uint local_64;
  uint local_5c;
  uint local_54;
  uint local_4c;
  uint local_44;
  uint local_3c;
  uint local_34;
  uint local_2c;
  int c_local;
  int z_local;
  int y_local;
  int x_local;
  CImg<unsigned_char> *this_local;
  
  if (x < 0) {
    local_2c = 0;
  }
  else {
    iVar1 = width(this);
    local_34 = x;
    if (iVar1 <= x) {
      iVar1 = width(this);
      local_34 = iVar1 - 1;
    }
    local_2c = local_34;
  }
  if (y < 0) {
    local_3c = 0;
  }
  else {
    iVar1 = height(this);
    local_44 = y;
    if (iVar1 <= y) {
      iVar1 = height(this);
      local_44 = iVar1 - 1;
    }
    local_3c = local_44;
  }
  if (z < 0) {
    local_4c = 0;
  }
  else {
    iVar1 = depth(this);
    local_54 = z;
    if (iVar1 <= z) {
      iVar1 = depth(this);
      local_54 = iVar1 - 1;
    }
    local_4c = local_54;
  }
  if (c < 0) {
    local_5c = 0;
  }
  else {
    iVar1 = spectrum(this);
    local_64 = c;
    if (iVar1 <= c) {
      iVar1 = spectrum(this);
      local_64 = iVar1 - 1;
    }
    local_5c = local_64;
  }
  puVar2 = operator()(this,local_2c,local_3c,local_4c,local_5c);
  return puVar2;
}

Assistant:

const T& _atXYZC(const int x, const int y, const int z, const int c) const {
      return (*this)(x<0?0:(x>=width()?width() - 1:x), y<0?0:(y>=height()?height() - 1:y),
                     z<0?0:(z>=depth()?depth() - 1:z), c<0?0:(c>=spectrum()?spectrum() - 1:c));
    }